

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcXsim.c
# Opt level: O0

int Abc_XsimAnd(int Value0,int Value1)

{
  int Value1_local;
  int Value0_local;
  
  if ((Value0 == 1) || (Value1 == 1)) {
    Value1_local = 1;
  }
  else if ((Value0 == 3) || (Value1 == 3)) {
    Value1_local = 3;
  }
  else {
    if ((Value0 != 2) || (Value1 != 2)) {
      __assert_fail("Value0 == XVS1 && Value1 == XVS1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcXsim.c"
                    ,0x33,"int Abc_XsimAnd(int, int)");
    }
    Value1_local = 2;
  }
  return Value1_local;
}

Assistant:

static inline int  Abc_XsimAnd( int Value0, int Value1 )   
{ 
    if ( Value0 == XVS0 || Value1 == XVS0 )
        return XVS0;
    if ( Value0 == XVSX || Value1 == XVSX )
        return XVSX;
    assert( Value0 == XVS1 && Value1 == XVS1 );
    return XVS1;
}